

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VCVT_fix_sp(DisasContext_conflict1 *s,arg_VCVT_fix_sp *a)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict1 *s_00;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  TCGTemp *a1;
  TCGTemp *pTVar6;
  TCGv_i32 pTVar7;
  uintptr_t o;
  code *func;
  uintptr_t o_2;
  TCGv_i64 ret;
  uintptr_t o_25;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i64 local_48;
  TCGTemp *local_38;
  
  uVar1 = s->isar->mvfr0;
  if ((uVar1 & 0xe0) != 0) {
    s_00 = s->uc->tcg_ctx;
    _Var3 = full_vfp_access_check(s,false);
    if (_Var3) {
      uVar5 = a->opc;
      iVar2 = a->imm;
      a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      uVar4 = a->vd << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)a1,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)(uVar4 & 4) + ((ulong)(uVar4 & 8) | (ulong)((uint)a->vd >> 2) << 8)
                          + 0xc10);
      pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      ret = (TCGv_i64)((long)pTVar6 - (long)s_00);
      tcg_gen_addi_i64_aarch64(s_00,ret,(TCGv_i64)s_00->cpu_env,0x2ec8);
      pTVar7 = tcg_const_i32_aarch64(s_00,((uVar5 & 1) * 0x10 - iVar2) + 0x10);
      if (7 < (uint)a->opc) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
                   ,0xab3,(char *)0x0);
      }
      switch(a->opc) {
      case 0:
        func = helper_vfp_shtos_aarch64;
        break;
      case 1:
        func = helper_vfp_sltos_aarch64;
        break;
      case 2:
        func = helper_vfp_uhtos_aarch64;
        break;
      case 3:
        func = helper_vfp_ultos_aarch64;
        break;
      case 4:
        func = helper_vfp_toshs_round_to_zero_aarch64;
        break;
      case 5:
        func = helper_vfp_tosls_round_to_zero_aarch64;
        break;
      case 6:
        func = helper_vfp_touhs_round_to_zero_aarch64;
        break;
      case 7:
        func = helper_vfp_touls_round_to_zero_aarch64;
      }
      local_48 = (TCGv_i64)((long)s_00 + (long)ret);
      local_50 = pTVar7 + (long)&s_00->pool_cur;
      local_58 = (TCGTemp *)((long)s_00 + ((long)a1 - (long)s_00));
      local_38 = a1;
      tcg_gen_callN_aarch64(s_00,func,local_58,3,&local_58);
      uVar5 = a->vd << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)local_38,(TCGArg)(s_00->cpu_env + (long)s_00)
                          ,(ulong)(uVar5 & 4) +
                           ((ulong)(uVar5 & 8) | (ulong)((uint)a->vd >> 2) << 8) + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)a1 - (long)s_00) + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar7 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
    }
  }
  return (uVar1 & 0xe0) != 0;
}

Assistant:

static bool trans_VCVT_fix_sp(DisasContext *s, arg_VCVT_fix_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 vd, shift;
    TCGv_ptr fpst;
    int frac_bits;

    if (!dc_isar_feature(aa32_fpsp_v3, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    frac_bits = (a->opc & 1) ? (32 - a->imm) : (16 - a->imm);

    vd = tcg_temp_new_i32(tcg_ctx);
    neon_load_reg32(tcg_ctx, vd, a->vd);

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    shift = tcg_const_i32(tcg_ctx, frac_bits);

    /* Switch on op:U:sx bits */
    switch (a->opc) {
    case 0:
        gen_helper_vfp_shtos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 1:
        gen_helper_vfp_sltos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 2:
        gen_helper_vfp_uhtos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 3:
        gen_helper_vfp_ultos(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 4:
        gen_helper_vfp_toshs_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 5:
        gen_helper_vfp_tosls_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 6:
        gen_helper_vfp_touhs_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    case 7:
        gen_helper_vfp_touls_round_to_zero(tcg_ctx, vd, vd, shift, fpst);
        break;
    default:
        g_assert_not_reached();
    }

    neon_store_reg32(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, vd);
    tcg_temp_free_i32(tcg_ctx, shift);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    return true;
}